

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleElement.cpp
# Opt level: O1

void __thiscall DoubleElement::DoubleElement(DoubleElement *this)

{
  string local_38;
  
  StreamObject::StreamObject(&this->super_StreamObject);
  (this->super_StreamObject)._vptr_StreamObject = (_func_int **)&PTR_write_0010ac30;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"DoubleElement","");
  StreamObject::setName(&this->super_StreamObject,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

DoubleElement::DoubleElement( )
{
	setName( "DoubleElement" );
}